

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
               *visited)

{
  undefined1 *puVar1;
  char *pcVar2;
  undefined4 uVar3;
  size_t sVar4;
  Type *this;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  pointer ppTVar9;
  pointer ppTVar10;
  ClassType *type_00;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Type *iface;
  locator res;
  ClassType *local_90;
  undefined8 local_88;
  arrays_type *local_80;
  ClassType *local_78;
  locator local_70;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  if (type->isInterface == true) {
    puVar1 = &(visited->super_Storage).field_0x28;
    local_88 = *(undefined8 *)&(visited->super_Storage).field_0x28;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = type;
    uVar11 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar8 = uVar11 >> (visited->field_0x30 & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar11 & 0xff];
    uVar12 = 0;
    uVar14 = uVar8;
    do {
      pcVar2 = (char *)(*(long *)&visited->field_0x40 + uVar14 * 0x10);
      local_48 = *pcVar2;
      cStack_47 = pcVar2[1];
      cStack_46 = pcVar2[2];
      bStack_45 = pcVar2[3];
      cStack_44 = pcVar2[4];
      cStack_43 = pcVar2[5];
      cStack_42 = pcVar2[6];
      bStack_41 = pcVar2[7];
      cStack_40 = pcVar2[8];
      cStack_3f = pcVar2[9];
      cStack_3e = pcVar2[10];
      bStack_3d = pcVar2[0xb];
      cStack_3c = pcVar2[0xc];
      cStack_3b = pcVar2[0xd];
      cStack_3a = pcVar2[0xe];
      bStack_39 = pcVar2[0xf];
      cVar16 = (char)uVar3;
      auVar20[0] = -(local_48 == cVar16);
      cVar17 = (char)((uint)uVar3 >> 8);
      auVar20[1] = -(cStack_47 == cVar17);
      cVar18 = (char)((uint)uVar3 >> 0x10);
      auVar20[2] = -(cStack_46 == cVar18);
      bVar19 = (byte)((uint)uVar3 >> 0x18);
      auVar20[3] = -(bStack_45 == bVar19);
      auVar20[4] = -(cStack_44 == cVar16);
      auVar20[5] = -(cStack_43 == cVar17);
      auVar20[6] = -(cStack_42 == cVar18);
      auVar20[7] = -(bStack_41 == bVar19);
      auVar20[8] = -(cStack_40 == cVar16);
      auVar20[9] = -(cStack_3f == cVar17);
      auVar20[10] = -(cStack_3e == cVar18);
      auVar20[0xb] = -(bStack_3d == bVar19);
      auVar20[0xc] = -(cStack_3c == cVar16);
      auVar20[0xd] = -(cStack_3b == cVar17);
      auVar20[0xe] = -(cStack_3a == cVar18);
      auVar20[0xf] = -(bStack_39 == bVar19);
      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
      local_90 = type;
      if (uVar15 != 0) {
        do {
          uVar5 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          if (*(ClassType **)(*(long *)&visited->field_0x48 + uVar14 * 0x78 + (ulong)uVar5 * 8) ==
              type) goto LAB_002b027e;
          uVar15 = uVar15 - 1 & uVar15;
        } while (uVar15 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bStack_39) == 0) break;
      lVar13 = uVar14 + uVar12;
      uVar12 = uVar12 + 1;
      uVar14 = lVar13 + 1U & *(ulong *)&visited->field_0x38;
    } while (uVar12 <= *(ulong *)&visited->field_0x38);
    if (*(ulong *)&visited->field_0x58 < *(ulong *)&visited->field_0x50) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*>
                (&local_70,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                  *)puVar1,(arrays_type *)&visited->field_0x30,uVar8,uVar11,(Symbol **)&local_90);
      *(long *)&visited->field_0x58 = *(long *)&visited->field_0x58 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                (&local_70,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                  *)puVar1,uVar11,(Symbol **)&local_90);
    }
    local_70.pg = (group15<boost::unordered::detail::foa::plain_integral> *)type;
    SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
              ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_70);
  }
LAB_002b027e:
  if ((type->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&type->super_Scope);
  }
  sVar4 = (type->implementsIfaces)._M_extent._M_extent_value;
  if (sVar4 != 0) {
    ppTVar10 = (type->implementsIfaces)._M_ptr;
    ppTVar9 = ppTVar10 + sVar4;
    puVar1 = &(visited->super_Storage).field_0x28;
    local_80 = (arrays_type *)&visited->field_0x30;
    do {
      local_90 = (ClassType *)*ppTVar10;
      local_88 = *(undefined8 *)&(visited->super_Storage).field_0x28;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_90;
      uVar11 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar8 = uVar11 >> (visited->field_0x30 & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar11 & 0xff];
      uVar12 = 0;
      uVar14 = uVar8;
      do {
        pcVar2 = (char *)(*(long *)&visited->field_0x40 + uVar14 * 0x10);
        local_58 = *pcVar2;
        cStack_57 = pcVar2[1];
        cStack_56 = pcVar2[2];
        bStack_55 = pcVar2[3];
        cStack_54 = pcVar2[4];
        cStack_53 = pcVar2[5];
        cStack_52 = pcVar2[6];
        bStack_51 = pcVar2[7];
        cStack_50 = pcVar2[8];
        cStack_4f = pcVar2[9];
        cStack_4e = pcVar2[10];
        bStack_4d = pcVar2[0xb];
        cStack_4c = pcVar2[0xc];
        cStack_4b = pcVar2[0xd];
        cStack_4a = pcVar2[0xe];
        bStack_49 = pcVar2[0xf];
        cVar16 = (char)uVar3;
        auVar21[0] = -(local_58 == cVar16);
        cVar17 = (char)((uint)uVar3 >> 8);
        auVar21[1] = -(cStack_57 == cVar17);
        cVar18 = (char)((uint)uVar3 >> 0x10);
        auVar21[2] = -(cStack_56 == cVar18);
        bVar19 = (byte)((uint)uVar3 >> 0x18);
        auVar21[3] = -(bStack_55 == bVar19);
        auVar21[4] = -(cStack_54 == cVar16);
        auVar21[5] = -(cStack_53 == cVar17);
        auVar21[6] = -(cStack_52 == cVar18);
        auVar21[7] = -(bStack_51 == bVar19);
        auVar21[8] = -(cStack_50 == cVar16);
        auVar21[9] = -(cStack_4f == cVar17);
        auVar21[10] = -(cStack_4e == cVar18);
        auVar21[0xb] = -(bStack_4d == bVar19);
        auVar21[0xc] = -(cStack_4c == cVar16);
        auVar21[0xd] = -(cStack_4b == cVar17);
        auVar21[0xe] = -(cStack_4a == cVar18);
        auVar21[0xf] = -(bStack_49 == bVar19);
        uVar15 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
        local_78 = local_90;
        if (uVar15 != 0) {
          do {
            uVar5 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (local_90 ==
                *(ClassType **)(*(long *)&visited->field_0x48 + uVar14 * 0x78 + (ulong)uVar5 * 8))
            goto LAB_002b03d7;
            uVar15 = uVar15 - 1 & uVar15;
          } while (uVar15 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bStack_49) == 0)
        break;
        lVar13 = uVar14 + uVar12;
        uVar12 = uVar12 + 1;
        uVar14 = lVar13 + 1U & *(ulong *)&visited->field_0x38;
      } while (uVar12 <= *(ulong *)&visited->field_0x38);
      if (*(ulong *)&visited->field_0x58 < *(ulong *)&visited->field_0x50) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
        ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*>
                  (&local_70,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                    *)puVar1,local_80,uVar8,uVar11,(Symbol **)&local_90);
        *(long *)&visited->field_0x58 = *(long *)&visited->field_0x58 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                  (&local_70,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                    *)puVar1,uVar11,(Symbol **)&local_90);
      }
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*const&>
                ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_78);
LAB_002b03d7:
      ppTVar10 = ppTVar10 + 1;
    } while (ppTVar10 != ppTVar9);
  }
  if ((type->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&type->super_Scope);
  }
  this = type->baseClass;
  if (this != (Type *)0x0) {
    type_00 = (ClassType *)this->canonical;
    if (type_00 == (ClassType *)0x0) {
      Type::resolveCanonical(this);
      type_00 = (ClassType *)this->canonical;
    }
    if ((type_00->super_Type).super_Symbol.kind != ErrorType) {
      findIfaces(type_00,ifaces,visited);
    }
  }
  return;
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}